

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxc.cxx
# Opt level: O0

void __thiscall
ExchCXX::detail::LibxcKernelImpl::eval_exc_vxc_
          (LibxcKernelImpl *this,int N,const_host_buffer_type rho,host_buffer_type eps,
          host_buffer_type vxc)

{
  undefined8 uVar1;
  bool bVar2;
  double *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  string *in_stack_ffffffffffffff98;
  xc_func_type *in_stack_ffffffffffffffa0;
  LibxcKernelImpl *in_stack_ffffffffffffffd0;
  
  throw_if_uninitialized(in_stack_ffffffffffffffd0);
  bVar2 = XCKernelImpl::is_lda((XCKernelImpl *)0x25bc2a);
  if (!bVar2) {
    uVar1 = __cxa_allocate_exception(0x50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    exchcxx_exception::exchcxx_exception
              ((exchcxx_exception *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               in_stack_ffffffffffffff94,in_stack_ffffffffffffff88);
    __cxa_throw(uVar1,&exchcxx_exception::typeinfo,exchcxx_exception::~exchcxx_exception);
  }
  xc_lda_exc_vxc(in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98,
                 (double *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 (double *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  return;
}

Assistant:

LDA_EXC_VXC_GENERATOR( LibxcKernelImpl::eval_exc_vxc_ ) const {

  throw_if_uninitialized();
  EXCHCXX_BOOL_CHECK("KERNEL IS NOT LDA",  is_lda() );
  xc_lda_exc_vxc( &kernel_, N, rho, eps, vxc );

}